

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNodeSetDel(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int local_1c;
  int i;
  xmlNodePtr val_local;
  xmlNodeSetPtr cur_local;
  
  if ((cur != (xmlNodeSetPtr)0x0) && (val != (xmlNodePtr)0x0)) {
    for (local_1c = 0; (local_1c < cur->nodeNr && (cur->nodeTab[local_1c] != val));
        local_1c = local_1c + 1) {
    }
    if (local_1c < cur->nodeNr) {
      if ((cur->nodeTab[local_1c] != (xmlNodePtr)0x0) &&
         (cur->nodeTab[local_1c]->type == XML_NAMESPACE_DECL)) {
        xmlXPathNodeSetFreeNs((xmlNsPtr)cur->nodeTab[local_1c]);
      }
      cur->nodeNr = cur->nodeNr + -1;
      for (; local_1c < cur->nodeNr; local_1c = local_1c + 1) {
        cur->nodeTab[local_1c] = cur->nodeTab[local_1c + 1];
      }
      cur->nodeTab[cur->nodeNr] = (xmlNodePtr)0x0;
    }
  }
  return;
}

Assistant:

void
xmlXPathNodeSetDel(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if (cur == NULL) return;
    if (val == NULL) return;

    /*
     * find node in nodeTab
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) break;

    if (i >= cur->nodeNr) {	/* not found */
#ifdef DEBUG
        xmlGenericError(xmlGenericErrorContext,
	        "xmlXPathNodeSetDel: Node %s wasn't found in NodeList\n",
		val->name);
#endif
        return;
    }
    if ((cur->nodeTab[i] != NULL) &&
	(cur->nodeTab[i]->type == XML_NAMESPACE_DECL))
	xmlXPathNodeSetFreeNs((xmlNsPtr) cur->nodeTab[i]);
    cur->nodeNr--;
    for (;i < cur->nodeNr;i++)
        cur->nodeTab[i] = cur->nodeTab[i + 1];
    cur->nodeTab[cur->nodeNr] = NULL;
}